

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_info.cpp
# Opt level: O1

void duckdb::Storage::VerifyBlockHeaderSize(idx_t block_header_size)

{
  InvalidInputException *pIVar1;
  string local_40;
  
  if ((block_header_size & 7) != 0) {
    pIVar1 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"the block size must a multiple of 8, got %llu","");
    InvalidInputException::InvalidInputException<unsigned_long>(pIVar1,&local_40,block_header_size);
    __cxa_throw(pIVar1,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (7 < block_header_size) {
    if (block_header_size < 0x81) {
      return;
    }
    pIVar1 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "the block header size must be lesser or equal than the maximum block size of %llu, got %llu"
               ,"");
    InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
              (pIVar1,&local_40,0x40000,block_header_size);
    __cxa_throw(pIVar1,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pIVar1 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "the block header size must be greater or equal than the default block header of %llu, got %llu"
             ,"");
  InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
            (pIVar1,&local_40,8,block_header_size);
  __cxa_throw(pIVar1,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Storage::VerifyBlockHeaderSize(const idx_t block_header_size) {
	if ((block_header_size & 7) != 0) {
		// Alignment to 8 bytes is necessary for computing the checksum
		throw InvalidInputException("the block size must a multiple of 8, got %llu", block_header_size);
	}
	if (block_header_size < DEFAULT_BLOCK_HEADER_SIZE) {
		throw InvalidInputException(
		    "the block header size must be greater or equal than the default block header of %llu, got %llu",
		    DEFAULT_BLOCK_HEADER_SIZE, block_header_size);
	}
	if (block_header_size > MAX_BLOCK_HEADER_SIZE) {
		throw InvalidInputException(
		    "the block header size must be lesser or equal than the maximum block size of %llu, got %llu",
		    MAX_BLOCK_ALLOC_SIZE, block_header_size);
	}
}